

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_csv_dataset.cpp
# Opt level: O2

int main(void)

{
  pointer __src;
  result_type_conflict rVar1;
  ostream *poVar2;
  result_type __sd;
  int counter;
  int iVar3;
  initializer_list<int> __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_streams;
  vector<int,_std::allocator<int>_> integers;
  uniform_int_distribution<int> dist;
  string pathToInsert;
  string pathToErase;
  string pathToFind;
  ofstream outputStreamForFind;
  byte abStack_1998 [480];
  ofstream outputStreamForInsert;
  byte abStack_1798 [480];
  ofstream outputStreamForErase;
  byte abStack_1598 [480];
  mt19937 engine;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&pathToFind,&kDatasetPathFind,(allocator<char> *)&engine);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&pathToErase,&kDatasetPathErase,(allocator<char> *)&engine);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&pathToInsert,&kDatasetPathInsert,(allocator<char> *)&engine);
  poVar2 = std::operator<<((ostream *)&std::cout,"Dataset pathToInsert: ");
  poVar2 = std::operator<<(poVar2,(string *)&pathToInsert);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Dataset pathToFind: ");
  poVar2 = std::operator<<(poVar2,(string *)&pathToFind);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Dataset pathToErase: ");
  poVar2 = std::operator<<(poVar2,(string *)&pathToErase);
  std::endl<char,std::char_traits<char>>(poVar2);
  output_streams.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  output_streams.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output_streams.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&output_streams,
             (char (*) [9])"/100.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&output_streams,
             (char (*) [9])"/500.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&output_streams,
             (char (*) [10])"/1000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&output_streams,
             (char (*) [10])"/5000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&output_streams,
             (char (*) [11])"/10000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&output_streams,
             (char (*) [11])"/50000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&output_streams,
             (char (*) [12])"/100000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&output_streams,
             (char (*) [12])"/500000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&output_streams,
             (char (*) [13])"/1000000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&output_streams,
             (char (*) [13])"/5000000.csv");
  engine._M_x[2] = 0xc35000002710;
  engine._M_x[3] = 0x7a120000186a0;
  engine._M_x[0] = 0x1f400000064;
  engine._M_x[1] = 0x1388000003e8;
  engine._M_x[4] = 0x4c4b40000f4240;
  __l._M_len = 10;
  __l._M_array = (iterator)&engine;
  std::vector<int,_std::allocator<int>_>::vector
            (&integers,__l,(allocator_type *)&outputStreamForFind);
  while (integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&engine,
                   &pathToFind,
                   output_streams.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::ofstream::ofstream(&outputStreamForFind,(string *)&engine,_S_trunc);
    std::__cxx11::string::~string((string *)&engine);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&engine,
                   &pathToErase,
                   output_streams.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::ofstream::ofstream((ostream *)&outputStreamForErase,(string *)&engine,_S_trunc);
    std::__cxx11::string::~string((string *)&engine);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&engine,
                   &pathToInsert,
                   output_streams.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::ofstream::ofstream((ostream *)&outputStreamForInsert,(string *)&engine,_S_trunc);
    std::__cxx11::string::~string((string *)&engine);
    __sd = std::chrono::_V2::system_clock::now();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&engine,__sd);
    dist._M_param._M_a = 0;
    dist._M_param._M_b = 10000000;
    if ((abStack_1998[*(long *)(_outputStreamForFind + -0x18)] & 5) == 0) {
      for (iVar3 = 0;
          iVar3 < *integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + -1; iVar3 = iVar3 + 1) {
        rVar1 = std::uniform_int_distribution<int>::operator()(&dist,&engine);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&outputStreamForFind,rVar1);
        std::operator<<(poVar2,',');
      }
      rVar1 = std::uniform_int_distribution<int>::operator()(&dist,&engine);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&outputStreamForFind,rVar1);
      std::operator<<(poVar2,'\n');
    }
    if ((abStack_1598[*(long *)(_outputStreamForErase + -0x18)] & 5) == 0) {
      for (iVar3 = 0;
          iVar3 < *integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + -1; iVar3 = iVar3 + 1) {
        rVar1 = std::uniform_int_distribution<int>::operator()(&dist,&engine);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&outputStreamForErase,rVar1);
        std::operator<<(poVar2,',');
      }
      rVar1 = std::uniform_int_distribution<int>::operator()(&dist,&engine);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&outputStreamForErase,rVar1);
      std::operator<<(poVar2,'\n');
    }
    if ((abStack_1798[*(long *)(_outputStreamForInsert + -0x18)] & 5) == 0) {
      for (iVar3 = 0;
          iVar3 < *integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + -1; iVar3 = iVar3 + 1) {
        rVar1 = std::uniform_int_distribution<int>::operator()(&dist,&engine);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&outputStreamForInsert,rVar1);
        std::operator<<(poVar2,',');
      }
      rVar1 = std::uniform_int_distribution<int>::operator()(&dist,&engine);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&outputStreamForInsert,rVar1);
      std::operator<<(poVar2,'\n');
    }
    __src = integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + 1;
    if (__src != integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      memmove(integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start,__src,
              (long)integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src);
    }
    integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&output_streams,
            (const_iterator)
            output_streams.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
    std::ofstream::~ofstream((ostream *)&outputStreamForInsert);
    std::ofstream::~ofstream((ostream *)&outputStreamForErase);
    std::ofstream::~ofstream(&outputStreamForFind);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&integers.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&output_streams);
  std::__cxx11::string::~string((string *)&pathToInsert);
  std::__cxx11::string::~string((string *)&pathToErase);
  std::__cxx11::string::~string((string *)&pathToFind);
  return 0;
}

Assistant:

int main() {
  const auto pathToFind = string(kDatasetPathFind);
  const auto pathToErase = string(kDatasetPathErase);
  const auto pathToInsert = string(kDatasetPathInsert);
  cout << "Dataset pathToInsert: " << pathToInsert << endl;
  cout << "Dataset pathToFind: " << pathToFind << endl;
  cout << "Dataset pathToErase: " << pathToErase << endl;

  vector<string> output_streams;
  output_streams.emplace_back("/100.csv");
  output_streams.emplace_back("/500.csv");
  output_streams.emplace_back("/1000.csv");
  output_streams.emplace_back("/5000.csv");
  output_streams.emplace_back("/10000.csv");
  output_streams.emplace_back("/50000.csv");
  output_streams.emplace_back("/100000.csv");
  output_streams.emplace_back("/500000.csv");
  output_streams.emplace_back("/1000000.csv");
  output_streams.emplace_back("/5000000.csv");

  vector<int> integers = {100, 500, 1000, 5000, 10000, 50000, 100000, 500000, 1000000, 5000000};

  while (!integers.empty()) {
    auto outputStreamForFind = ofstream(pathToFind + output_streams.front(), ios::ios_base::trunc);
    auto outputStreamForErase = ofstream(pathToErase + output_streams.front(), ios::ios_base::trunc);
    auto outputStreamForInsert = ofstream(pathToInsert + output_streams.front(), ios::ios_base::trunc);

    const auto seed = chrono::system_clock::now().time_since_epoch().count();
    auto engine = mt19937(seed);  // без seed`а генератор будет выдавать одни и те же значения
    auto dist = uniform_int_distribution(0, 10000000);  // равновероятное распределение генерируемых чисел

    if (outputStreamForFind) {
      for (int counter = 0; counter < integers.front() - 1; counter++) {
        outputStreamForFind << dist(engine) << ',';
      }
      outputStreamForFind << dist(engine) << '\n';
    }

    if (outputStreamForErase) {
      for (int counter = 0; counter < integers.front() - 1; counter++) {
        outputStreamForErase << dist(engine) << ',';
      }
      outputStreamForErase << dist(engine) << '\n';
    }

    if (outputStreamForInsert) {
      for (int counter = 0; counter < integers.front() - 1; counter++) {
        outputStreamForInsert << dist(engine) << ',';
      }
      outputStreamForInsert << dist(engine) << '\n';
    }

    integers.erase(integers.begin());
    output_streams.erase(output_streams.begin());
  }

  return 0;
}